

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_functions.cpp
# Opt level: O3

Value * duckdb::TableFunctionExtractor::GetVarArgs
                  (Value *__return_storage_ptr__,TableFunctionCatalogEntry *entry,idx_t offset)

{
  bool bVar1;
  TableFunction fun;
  LogicalType local_200;
  string local_1e8;
  TableFunction local_1c8;
  
  FunctionSet<duckdb::TableFunction>::GetFunctionByOffset
            (&local_1c8,&(entry->functions).super_FunctionSet<duckdb::TableFunction>,offset);
  bVar1 = SimpleFunction::HasVarArgs((SimpleFunction *)&local_1c8);
  if (bVar1) {
    LogicalType::ToString_abi_cxx11_
              (&local_1e8,&local_1c8.super_SimpleNamedParameterFunction.super_SimpleFunction.varargs
              );
    Value::Value(__return_storage_ptr__,&local_1e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p);
    }
  }
  else {
    LogicalType::LogicalType(&local_200,SQLNULL);
    Value::Value(__return_storage_ptr__,&local_200);
    LogicalType::~LogicalType(&local_200);
  }
  local_1c8.super_SimpleNamedParameterFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__TableFunction_02439e90;
  if (local_1c8.function_info.internal.
      super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1c8.function_info.internal.
               super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  SimpleNamedParameterFunction::~SimpleNamedParameterFunction
            (&local_1c8.super_SimpleNamedParameterFunction);
  return __return_storage_ptr__;
}

Assistant:

static Value GetVarArgs(TableFunctionCatalogEntry &entry, idx_t offset) {
		auto fun = entry.functions.GetFunctionByOffset(offset);
		return !fun.HasVarArgs() ? Value() : Value(fun.varargs.ToString());
	}